

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O3

int DataManager::getLinkType(int index,int *type,Network *nw)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  char *__to;
  Valve *valve;
  long *plVar4;
  
  *type = 1;
  iVar2 = 0xcd;
  if ((-1 < index) && (iVar1 = Network::count(nw,LINK), index < iVar1)) {
    iVar2 = Network::link(nw,(char *)(ulong)(uint)index,__to);
    plVar4 = (long *)CONCAT44(extraout_var,iVar2);
    iVar2 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (iVar2 == 0) {
      uVar3 = *(byte *)(plVar4 + 0x13) ^ 1;
    }
    else {
      iVar2 = (**(code **)(*plVar4 + 0x10))(plVar4);
      uVar3 = 2;
      if (iVar2 != 1) {
        iVar2 = (**(code **)(*plVar4 + 0x10))(plVar4);
        if (iVar2 != 2) {
          return 0;
        }
        iVar2 = (**(code **)(*plVar4 + 0x10))(plVar4);
        uVar3 = iVar2 + 2;
      }
    }
    *type = uVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int DataManager::getLinkType(int index, int* type, Network* nw)
{
    *type = EN_PIPE;
    if ( index < 0 || index >= nw->count(Element::LINK) ) return 205;
    Link* link = nw->link(index);
    if ( link->type() == Link::PIPE )
    {
        Pipe* pipe = static_cast<Pipe*>(link);
        if ( pipe->hasCheckValve ) *type = EN_CVPIPE;
        else                       *type = EN_PIPE;
    }
    else if (link->type() == Link::PUMP ) *type = EN_PUMP;
    else if ( link->type() == Link::VALVE )
    {
        Valve* valve = static_cast<Valve*>(link);
        *type = valve->type() + EN_PUMP;
    }
    return 0;
}